

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void google::protobuf::FileDescriptorTables::BuildLocationsByPath
               (pair<const_google::protobuf::FileDescriptorTables_*,_const_google::protobuf::SourceCodeInfo_*>
                *p)

{
  FileDescriptorTables *pFVar1;
  RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *this;
  SourceCodeInfo_Location *this_00;
  RepeatedField<int> *this_01;
  mapped_type *ppSVar2;
  SourceCodeInfo_Location *in_RCX;
  string local_40;
  SourceCodeInfo_Location *local_20;
  SourceCodeInfo_Location *loc;
  int len;
  int i;
  pair<const_google::protobuf::FileDescriptorTables_*,_const_google::protobuf::SourceCodeInfo_*>
  *p_local;
  
  loc._4_4_ = 0;
  _len = p;
  loc._0_4_ = SourceCodeInfo::location_size(p->second);
  for (; loc._4_4_ < (int)loc; loc._4_4_ = loc._4_4_ + 1) {
    this = SourceCodeInfo::location(_len->second);
    this_00 = RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::Get(this,loc._4_4_);
    pFVar1 = _len->first;
    local_20 = this_00;
    this_01 = SourceCodeInfo_Location::path(this_00);
    Join<google::protobuf::RepeatedField<int>>
              (&local_40,(protobuf *)this_01,(RepeatedField<int> *)0x77e1fa,(char *)in_RCX);
    ppSVar2 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>
              ::operator[](&pFVar1->locations_by_path_,&local_40);
    *ppSVar2 = this_00;
    std::__cxx11::string::~string((string *)&local_40);
    in_RCX = this_00;
  }
  return;
}

Assistant:

void FileDescriptorTables::BuildLocationsByPath(
    std::pair<const FileDescriptorTables*, const SourceCodeInfo*>* p) {
  for (int i = 0, len = p->second->location_size(); i < len; ++i) {
    const SourceCodeInfo_Location* loc = &p->second->location().Get(i);
    p->first->locations_by_path_[Join(loc->path(), ",")] = loc;
  }
}